

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_dense.c
# Opt level: O0

void SUNDlsMat_denseCopy(sunrealtype **a,sunrealtype **b,sunindextype m,sunindextype n)

{
  sunrealtype *psVar1;
  sunrealtype *psVar2;
  sunrealtype *b_col_j;
  sunrealtype *a_col_j;
  sunindextype j;
  sunindextype i;
  sunindextype n_local;
  sunindextype m_local;
  sunrealtype **b_local;
  sunrealtype **a_local;
  
  for (j = 0; j < n; j = j + 1) {
    psVar1 = a[j];
    psVar2 = b[j];
    for (i = 0; i < m; i = i + 1) {
      psVar2[i] = psVar1[i];
    }
  }
  return;
}

Assistant:

void SUNDlsMat_denseCopy(sunrealtype** a, sunrealtype** b, sunindextype m,
                         sunindextype n)
{
  sunindextype i, j;
  sunrealtype *a_col_j, *b_col_j;

  for (j = 0; j < n; j++)
  {
    a_col_j = a[j];
    b_col_j = b[j];
    for (i = 0; i < m; i++) { b_col_j[i] = a_col_j[i]; }
  }
}